

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_6,_2>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int row;
  long lVar1;
  float fVar2;
  float fVar3;
  Type in0;
  Vector<float,_3> res;
  int aiStack_18 [6];
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar1 = 0;
    do {
      fVar3 = 1.0;
      if (lVar1 != 0) {
        fVar3 = 0.0;
      }
      in0.m_data.m_data[0].m_data[lVar1] = fVar3;
      fVar3 = 1.0;
      if (lVar1 != 1) {
        fVar3 = 0.0;
      }
      in0.m_data.m_data[1].m_data[lVar1] = fVar3;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    in0.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    in0.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    in0.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    in0.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  }
  else {
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    in0.m_data.m_data[0].m_data[2] = 0.0;
    in0.m_data.m_data[1].m_data[0] = 0.0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
    in0.m_data.m_data[1].m_data[2] = 0.0;
    lVar1 = 0;
    do {
      fVar3 = (float)(&DAT_00ae3c74)[lVar1 * 2];
      in0.m_data.m_data[0].m_data[lVar1] = (float)(&s_constInMat2x3)[lVar1 * 2];
      in0.m_data.m_data[1].m_data[lVar1] = fVar3;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    fVar2 = (evalCtx->coords).m_data[1];
    fVar3 = (evalCtx->coords).m_data[0];
  }
  else {
    fVar2 = 1.0;
    fVar3 = 0.5;
  }
  res.m_data[2] = 0.0;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    res.m_data[lVar1] =
         in0.m_data.m_data[1].m_data[lVar1] * fVar2 +
         in0.m_data.m_data[0].m_data[lVar1] * fVar3 + 0.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar1]] = res.m_data[lVar1 + -2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}